

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Market.cpp
# Opt level: O2

bool __thiscall Market::insert(Market *this,Order *order)

{
  pair<const_double,_Order> local_d8;
  
  if (order->m_side == buy) {
    local_d8.first = order->m_price;
    Order::Order(&local_d8.second,order);
    std::
    _Rb_tree<double,std::pair<double_const,Order>,std::_Select1st<std::pair<double_const,Order>>,std::greater<double>,std::allocator<std::pair<double_const,Order>>>
    ::_M_insert_equal<std::pair<double_const,Order>>
              ((_Rb_tree<double,std::pair<double_const,Order>,std::_Select1st<std::pair<double_const,Order>>,std::greater<double>,std::allocator<std::pair<double_const,Order>>>
                *)&this->m_bidOrders,&local_d8);
  }
  else {
    local_d8.first = order->m_price;
    Order::Order(&local_d8.second,order);
    std::
    _Rb_tree<double,std::pair<double_const,Order>,std::_Select1st<std::pair<double_const,Order>>,std::less<double>,std::allocator<std::pair<double_const,Order>>>
    ::_M_insert_equal<std::pair<double_const,Order>>
              ((_Rb_tree<double,std::pair<double_const,Order>,std::_Select1st<std::pair<double_const,Order>>,std::less<double>,std::allocator<std::pair<double_const,Order>>>
                *)&this->m_askOrders,&local_d8);
  }
  Order::~Order(&local_d8.second);
  return true;
}

Assistant:

bool Market::insert(const Order &order) {
  if (order.getSide() == Order::buy) {
    m_bidOrders.insert(BidOrders::value_type(order.getPrice(), order));
  } else {
    m_askOrders.insert(AskOrders::value_type(order.getPrice(), order));
  }
  return true;
}